

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O1

void __thiscall
QSortFilterProxyModelPrivate::updateChildrenMapping
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,Mapping *parent_mapping,
          Direction direction,int start,int end,int delta_item_count,bool remove)

{
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  int iVar1;
  QAbstractItemModel *pQVar2;
  Mapping *pMVar3;
  Mapping *pMVar4;
  iterator abegin;
  iterator iVar5;
  undefined8 *puVar6;
  int iVar7;
  QList<QModelIndex> *this_01;
  long lVar8;
  Mapping **args;
  long in_FS_OFFSET;
  Mapping *cm;
  Mapping *local_c0;
  QModelIndexWrapper local_b8;
  Mapping *local_98;
  Mapping *pMStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  QArrayData *local_78;
  long lStack_70;
  long local_68;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = (QArrayData *)0x0;
  lStack_70 = 0;
  local_68 = 0;
  this_01 = &parent_mapping->mapped_children;
  abegin = QList<QModelIndex>::begin(this_01);
  iVar7 = -delta_item_count;
  if (!remove) {
    iVar7 = delta_item_count;
  }
  this_00 = &(this->super_QAbstractProxyModelPrivate).model;
LAB_00485997:
  do {
    iVar5 = QList<QModelIndex>::end(this_01);
    if (abegin.i == iVar5.i) {
      if (local_68 != 0) {
        args = (Mapping **)(lStack_70 + 0x18);
        lVar8 = local_68 << 5;
        do {
          pMVar3 = *args;
          (pMVar3->source_parent).m.ptr = (QAbstractItemModel *)args[-1];
          pMVar4 = args[-2];
          *(Mapping **)&pMVar3->source_parent = args[-3];
          (pMVar3->source_parent).i = (quintptr)pMVar4;
          local_88.ptr = (QAbstractItemModel *)args[-1];
          local_98 = args[-3];
          pMStack_90 = args[-2];
          local_58._0_8_ = local_98;
          local_58.i = (quintptr)pMStack_90;
          local_58.m.ptr = local_88.ptr;
          QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*>::
          emplace<QSortFilterProxyModelPrivate::Mapping*const&>
                    ((QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*> *)
                     &this->source_index_mapping,(QModelIndexWrapper *)&local_58,args);
          args = args + 4;
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != 0);
      }
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,0x20,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    local_58.m.ptr = ((abegin.i)->m).ptr;
    local_58.i = (abegin.i)->i;
    local_58.r = (abegin.i)->r;
    local_58.c = (abegin.i)->c;
    puVar6 = (undefined8 *)((long)&local_58 + 4);
    if (direction == Rows) {
      puVar6 = (undefined8 *)&local_58;
    }
    iVar1 = *(int *)puVar6;
    if (start <= iVar1) {
      if (iVar1 <= end && remove) {
        abegin = QList<QModelIndex>::erase(this_01,abegin.i,abegin.i + 1);
        remove_from_mapping(this,&local_58);
        goto LAB_00485997;
      }
      local_98 = (Mapping *)0xffffffffffffffff;
      pMStack_90 = (Mapping *)0x0;
      local_88.ptr = (QAbstractItemModel *)0x0;
      if (direction == Rows) {
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_00);
        pQVar2 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
        (*(pQVar2->super_QObject)._vptr_QObject[0xc])
                  (&local_b8,pQVar2,(ulong)(uint)(iVar1 + iVar7),(ulong)local_58._0_8_ >> 0x20,
                   source_parent);
      }
      else {
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_00);
        pQVar2 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
        (*(pQVar2->super_QObject)._vptr_QObject[0xc])
                  (&local_b8,pQVar2,local_58._0_8_ & 0xffffffff,(ulong)(uint)(iVar1 + iVar7),
                   source_parent);
      }
      local_88.ptr = local_b8.index.m.ptr;
      local_98 = (Mapping *)local_b8.index._0_8_;
      pMStack_90 = (Mapping *)local_b8.index.i;
      ((abegin.i)->m).ptr = local_b8.index.m.ptr;
      (abegin.i)->r = local_b8.index.r;
      (abegin.i)->c = local_b8.index.c;
      (abegin.i)->i = local_b8.index.i;
      local_b8.index.m.ptr = local_58.m.ptr;
      local_b8.index.r = local_58.r;
      local_b8.index.c = local_58.c;
      local_b8.index.i = local_58.i;
      local_c0 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
                 takeImpl<QtPrivate::QModelIndexWrapper>(&this->source_index_mapping,&local_b8);
      QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>>::
      emplace<QModelIndex&,QSortFilterProxyModelPrivate::Mapping*&>
                ((QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>> *)
                 &local_78,local_68,(QModelIndex *)&local_98,&local_c0);
      QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::end
                ((QList<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *)
                 &local_78);
    }
    abegin.i = abegin.i + 1;
  } while( true );
}

Assistant:

void QSortFilterProxyModelPrivate::updateChildrenMapping(const QModelIndex &source_parent, Mapping *parent_mapping,
                                                         Direction direction, int start, int end, int delta_item_count, bool remove)
{
    // see if any mapped children should be (re)moved
    QList<std::pair<QModelIndex, Mapping *>> moved_source_index_mappings;
    auto it2 = parent_mapping->mapped_children.begin();
    for ( ; it2 != parent_mapping->mapped_children.end();) {
        const QModelIndex source_child_index = *it2;
        const int pos = (direction == Direction::Rows)
                        ? source_child_index.row()
                        : source_child_index.column();
        if (pos < start) {
            // not affected
            ++it2;
        } else if (remove && pos <= end) {
            // in the removed interval
            it2 = parent_mapping->mapped_children.erase(it2);
            remove_from_mapping(source_child_index);
        } else {
            // below the removed items -- recompute the index
            QModelIndex new_index;
            const int newpos = remove ? pos - delta_item_count : pos + delta_item_count;
            if (direction == Direction::Rows) {
                new_index = model->index(newpos,
                                         source_child_index.column(),
                                         source_parent);
            } else {
                new_index = model->index(source_child_index.row(),
                                         newpos,
                                         source_parent);
            }
            *it2 = new_index;
            ++it2;

            // update mapping
            Mapping *cm = source_index_mapping.take(source_child_index);
            Q_ASSERT(cm);
            // we do not reinsert right away, because the new index might be identical with another, old index
            moved_source_index_mappings.emplace_back(new_index, cm);
        }
    }

    // reinsert moved, mapped indexes
    for (auto &pair : std::as_const(moved_source_index_mappings)) {
        pair.second->source_parent = pair.first;
        source_index_mapping.insert(pair.first, pair.second);
    }
}